

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O1

int64_t av1_model_rd_for_sb_uv
                  (AV1_COMP *cpi,BLOCK_SIZE plane_bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                  RD_STATS *this_rdc,int start_plane,int stop_plane)

{
  byte bVar1;
  short sVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  buf_2d *pbVar8;
  int rate;
  uint sse;
  int local_84;
  long local_80;
  uint local_78;
  uint local_74;
  MACROBLOCK *local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  RD_STATS *local_50;
  AV1_COMP *local_48;
  uint8_t *local_40;
  long local_38;
  
  this_rdc->rate = 0;
  this_rdc->dist = 0;
  this_rdc->skip_txfm = '\0';
  local_70 = x;
  if (stop_plane < start_plane) {
    lVar7 = 0;
  }
  else {
    local_60 = (ulong)plane_bsize;
    pbVar8 = &x->plane[start_plane].src;
    piVar4 = &xd->plane[start_plane].dst.stride;
    local_40 = x->color_sensitivity_sb_alt + (long)start_plane + 1;
    uVar5 = (ulong)((stop_plane - start_plane) + 1);
    lVar6 = 0;
    local_68 = local_60 * 0x70;
    lVar7 = 0;
    local_58 = uVar5;
    local_50 = this_rdc;
    local_48 = cpi;
    do {
      if (local_40[lVar6] != '\0') {
        local_78 = (uint)(*(int16_t **)((long)(pbVar8 + 2) + 0x10))[1];
        sVar2 = **(int16_t **)((long)(pbVar8 + 2) + 0x10);
        uVar3 = (**(code **)((long)&local_48->ppi->fn_ptr[0].vf + local_68))
                          (pbVar8->buf,pbVar8->stride,((buf_2d *)(piVar4 + -6))->buf,*piVar4,
                           &local_74);
        this_rdc = local_50;
        local_38 = lVar7 + (ulong)local_74;
        bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_60];
        av1_model_rd_from_var_lapndz
                  ((ulong)(local_74 - uVar3),(uint)bVar1,(uint)(int)sVar2 >> 3,&local_84,&local_80);
        lVar7 = local_38;
        this_rdc->rate = this_rdc->rate + (local_84 >> 1);
        this_rdc->dist = this_rdc->dist + local_80 * 8;
        av1_model_rd_from_var_lapndz((ulong)uVar3,(uint)bVar1,local_78 >> 3,&local_84,&local_80);
        this_rdc->rate = this_rdc->rate + local_84;
        this_rdc->dist = this_rdc->dist + local_80 * 0x10;
        uVar5 = local_58;
      }
      pbVar8 = (buf_2d *)((long)(pbVar8 + 4) + 8);
      piVar4 = piVar4 + 0x28c;
      lVar6 = lVar6 + 1;
    } while ((int)uVar5 != (int)lVar6);
  }
  if ((long)this_rdc->rate == 0) {
    this_rdc->skip_txfm = '\x01';
  }
  if (lVar7 * 0x800 <=
      this_rdc->dist * 0x80 + ((long)local_70->rdmult * (long)this_rdc->rate + 0x100 >> 9)) {
    this_rdc->rate = 0;
    this_rdc->dist = lVar7 << 4;
    this_rdc->skip_txfm = '\x01';
  }
  return lVar7;
}

Assistant:

int64_t av1_model_rd_for_sb_uv(AV1_COMP *cpi, BLOCK_SIZE plane_bsize,
                               MACROBLOCK *x, MACROBLOCKD *xd,
                               RD_STATS *this_rdc, int start_plane,
                               int stop_plane) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  int rate;
  int64_t dist;
  int plane;
  int64_t tot_sse = 0;

  this_rdc->rate = 0;
  this_rdc->dist = 0;
  this_rdc->skip_txfm = 0;

  for (plane = start_plane; plane <= stop_plane; ++plane) {
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const uint32_t dc_quant = p->dequant_QTX[0];
    const uint32_t ac_quant = p->dequant_QTX[1];
    const BLOCK_SIZE bs = plane_bsize;
    unsigned int var;
    if (!x->color_sensitivity[COLOR_SENS_IDX(plane)]) continue;

    var = cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, pd->dst.buf,
                                  pd->dst.stride, &sse);
    assert(sse >= var);
    tot_sse += sse;

    av1_model_rd_from_var_lapndz(sse - var, num_pels_log2_lookup[bs],
                                 dc_quant >> 3, &rate, &dist);

    this_rdc->rate += rate >> 1;
    this_rdc->dist += dist << 3;

    av1_model_rd_from_var_lapndz(var, num_pels_log2_lookup[bs], ac_quant >> 3,
                                 &rate, &dist);

    this_rdc->rate += rate;
    this_rdc->dist += dist << 4;
  }

  if (this_rdc->rate == 0) {
    this_rdc->skip_txfm = 1;
  }

  if (RDCOST(x->rdmult, this_rdc->rate, this_rdc->dist) >=
      RDCOST(x->rdmult, 0, tot_sse << 4)) {
    this_rdc->rate = 0;
    this_rdc->dist = tot_sse << 4;
    this_rdc->skip_txfm = 1;
  }

  return tot_sse;
}